

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseBandwidth.cpp
# Opt level: O1

void __thiscall tonk::ReceiverStatistics::Compress(ReceiverStatistics *this,uint8_t *buffer)

{
  uint uVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  uint8_t uVar4;
  undefined2 uVar5;
  int iVar6;
  
  if (0.0 < this->LossRate) {
    auVar2 = vfmadd213ss_fma(SUB6416(ZEXT464(0x43800000),0),ZEXT416((uint)this->LossRate),
                             ZEXT416(0x3f000000));
    iVar6 = (int)auVar2._0_4_;
    if (0 < iVar6) {
      if (0xfe < iVar6) {
        iVar6 = 0xff;
      }
      uVar4 = (uint8_t)iVar6;
      goto LAB_00115260;
    }
  }
  uVar4 = '\0';
LAB_00115260:
  *buffer = uVar4;
  uVar1 = this->GoodputBPS;
  if (uVar1 == 0) {
    uVar5 = 0;
  }
  else {
    uVar3 = (0x15U - LZCOUNT(uVar1)) * 0x800 | uVar1 >> (0x15U - LZCOUNT(uVar1) & 0x1f);
    if (uVar1 < 0x800) {
      uVar3 = uVar1;
    }
    uVar5 = (undefined2)uVar3;
  }
  *(undefined2 *)(buffer + 1) = uVar5;
  uVar1 = this->TripUsec;
  if (uVar1 == 0) {
    uVar5 = 0;
  }
  else {
    uVar3 = (0x15U - LZCOUNT(uVar1)) * 0x800 | uVar1 >> (0x15U - LZCOUNT(uVar1) & 0x1f);
    if (uVar1 < 0x800) {
      uVar3 = uVar1;
    }
    uVar5 = (undefined2)uVar3;
  }
  *(undefined2 *)(buffer + 3) = uVar5;
  return;
}

Assistant:

void ReceiverStatistics::Compress(uint8_t* buffer) const
{
    uint8_t lossRateByte = 0;
    if (LossRate > 0.f)
    {
        const int lossRateInt = static_cast<int>(LossRate * 256.f + 0.5f);
        if (lossRateInt > 0)
        {
            if (lossRateInt >= 255) {
                lossRateByte = 255;
            }
            else {
                lossRateByte = static_cast<uint8_t>(lossRateInt);
            }
        }
    }
    buffer[0] = lossRateByte;

    siamese::WriteU16_LE(buffer + 1, FixedPointCompress32to16(GoodputBPS));
    siamese::WriteU16_LE(buffer + 3, FixedPointCompress32to16(TripUsec));
}